

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomvec(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  uint uVar1;
  etype eVar2;
  line *plVar3;
  char *__s;
  ulonglong uVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  ulonglong uVar7;
  expr *peVar8;
  ull uVar9;
  ull uVar10;
  expr *peVar11;
  char *pcVar12;
  expr **ppeVar13;
  expr **ppeVar14;
  matches *pmVar15;
  match *__dest;
  long lVar16;
  ulonglong uVar17;
  ulong uVar18;
  int iVar19;
  expr *res_1;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  char *end;
  match res;
  ulonglong local_130;
  expr **local_120;
  char *local_f0;
  match local_e8;
  
  if (ctx->reverse == 0) {
    peVar8 = (expr *)calloc(0x48,1);
    peVar8->type = EXPR_VEC;
    uVar9 = getbf(*(bitfield **)((long)v + 8),a,m,ctx);
    uVar10 = getbf(*(bitfield **)((long)v + 0x10),a,m,ctx);
    if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
      local_130 = 0xffffffffffffffff;
    }
    else {
      local_130 = getbf(*(bitfield **)((long)v + 0x18),a,m,ctx);
    }
    if (uVar10 != 0) {
      local_120 = (expr **)0x0;
      iVar19 = 0;
      iVar21 = 0;
      iVar5 = 0;
      uVar20 = 0;
      iVar6 = 0;
      ppeVar14 = (expr **)0x0;
      do {
        peVar11 = (expr *)calloc(0x48,1);
        if ((local_130 >> (uVar20 & 0x3f) & 1) == 0) {
          peVar11->type = EXPR_DISCARD;
          iVar21 = iVar19;
          ppeVar13 = local_120;
        }
        else {
          peVar11->type = EXPR_REG;
          peVar11->special = *(int *)((long)v + 0x20);
          lVar16 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pcVar12 = aprint("%s%lld",*v,lVar16 + uVar9);
          peVar11->str = pcVar12;
          ppeVar13 = ppeVar14;
        }
        if (iVar21 <= iVar5) {
          bVar22 = iVar21 == 0;
          iVar21 = iVar21 * 2;
          if (bVar22) {
            iVar21 = 0x10;
          }
          peVar8->vexprsmax = iVar21;
          ppeVar13 = (expr **)realloc(ppeVar14,(long)iVar21 << 3);
          peVar8->vexprs = ppeVar13;
          iVar5 = peVar8->vexprsnum;
          iVar19 = iVar21;
          local_120 = ppeVar13;
        }
        lVar16 = (long)iVar5;
        iVar5 = iVar5 + 1;
        peVar8->vexprsnum = iVar5;
        ppeVar13[lVar16] = peVar11;
        uVar20 = uVar20 + 1;
        ppeVar14 = ppeVar13;
      } while (uVar10 != uVar20);
    }
    iVar5 = ctx->atomsnum;
    iVar6 = ctx->atomsmax;
    if (iVar5 < iVar6) {
      ppeVar14 = ctx->atoms;
    }
    else {
      iVar5 = 0x10;
      if (iVar6 != 0) {
        iVar5 = iVar6 * 2;
      }
      ctx->atomsmax = iVar5;
      ppeVar14 = (expr **)realloc(ctx->atoms,(long)iVar5 << 3);
      ctx->atoms = ppeVar14;
      iVar5 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar5 + 1;
    ppeVar14[iVar5] = peVar8;
  }
  else {
    plVar3 = ctx->line;
    if (plVar3->atomsnum != spos) {
      memset(&local_e8,0,0xb8);
      local_e8.lpos = spos + 1;
      peVar8 = plVar3->atoms[spos];
      if (peVar8->type != EXPR_VEC) {
        return (matches *)0x0;
      }
      uVar1 = peVar8->vexprsnum;
      if ((long)(int)uVar1 == 0) {
        local_130 = 0;
        uVar20 = 0;
      }
      else {
        uVar18 = 0;
        uVar17 = 0;
        uVar20 = 0;
        local_130 = 0;
        do {
          eVar2 = peVar8->vexprs[uVar18]->type;
          if (eVar2 != EXPR_DISCARD) {
            if (eVar2 != EXPR_REG) {
              return (matches *)0x0;
            }
            pcVar12 = peVar8->vexprs[uVar18]->str;
            __s = *v;
            __n = strlen(__s);
            iVar5 = strncmp(pcVar12,__s,__n);
            if (iVar5 != 0) {
              return (matches *)0x0;
            }
            uVar7 = strtoull(pcVar12 + __n,&local_f0,10);
            if (*local_f0 != '\0') {
              return (matches *)0x0;
            }
            uVar4 = uVar7;
            if ((uVar20 != 0) &&
               (bVar22 = uVar7 != uVar17, uVar7 = uVar17, uVar4 = local_130, bVar22)) {
              return (matches *)0x0;
            }
            local_130 = uVar4;
            uVar17 = uVar7 + 1;
            uVar20 = uVar20 | 1L << (uVar18 & 0x3f);
          }
          uVar18 = uVar18 + 1;
        } while (uVar1 != uVar18);
      }
      iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 8),local_130);
      if ((iVar5 != 0) &&
         (iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x10),(long)(int)uVar1), iVar5 != 0)) {
        if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
          if ((uVar20 ^ -1L << ((byte)uVar1 & 0x3f)) == 0xffffffffffffffff) goto LAB_00170a97;
        }
        else {
          iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x18),uVar20);
          if (iVar5 != 0) {
LAB_00170a97:
            pmVar15 = (matches *)calloc(0x10,1);
            pmVar15->mmax = 0x10;
            __dest = (match *)malloc(0xb80);
            pmVar15->m = __dest;
            pmVar15->mnum = 1;
            memcpy(__dest,&local_e8,0xb8);
            return pmVar15;
          }
        }
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec APROTO {
	const struct vec *vec = v;
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_VEC);
		ull base = GETBF(vec->bf);
		ull cnt = GETBF(vec->cnt);
		ull mask = -1ull;
		if (vec->mask)
			mask = GETBF(vec->mask);
		int k = 0, i;
		for (i = 0; i < cnt; i++) {
			if (mask & 1ull<<i) {
				struct expr *sexpr = makeex(EXPR_REG);
				sexpr->special = vec->cool;
				sexpr->str = aprint("%s%lld", vec->name,  base + k++);
				ADDARRAY(expr->vexprs, sexpr);
			} else {
				struct expr *sexpr = makeex(EXPR_DISCARD);
				ADDARRAY(expr->vexprs, sexpr);
			}
		}
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct match res = { 0, .lpos = spos+1 };
		const struct expr *expr = ctx->line->atoms[spos];
		if (expr->type != EXPR_VEC)
			return 0;
		ull start = 0, cnt = expr->vexprsnum, mask = 0, cur = 0;
		int i;
		for (i = 0; i < cnt; i++) {
			const struct expr *e = expr->vexprs[i];
			if (e->type == EXPR_DISCARD) {
			} else if (e->type == EXPR_REG) {
				if (strncmp(e->str, vec->name, strlen(vec->name)))
					return 0;
				char *end;
				ull num = strtoull(e->str + strlen(vec->name), &end, 10);
				if (*end)
					return 0;
				if (mask) {
					if (num != cur)
						return 0;
					cur++;
				} else {
					start = num;
					cur = num + 1;
				}
				mask |= 1ull << i;
			} else {
				return 0;
			}
		}
		if (!setbf(&res, vec->bf, start))
			return 0;
		if (!setbf(&res, vec->cnt, cnt))
			return 0;
		if (vec->mask) {
			if (!setbf(&res, vec->mask, mask))
				return 0;
		} else {
			if (mask != (1ull << cnt) - 1)
			       return 0;	
		}
		struct matches *rres = emptymatches();
		ADDARRAY(rres->m, res);
		return rres;
	}
}